

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall QTableModel::removeRows(QTableModel *this,int row,int count,QModelIndex *param_3)

{
  QTableWidgetItem *pQVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < row && 0 < count) {
    if ((ulong)(uint)(count + row) <= (ulong)(this->verticalHeaderItems).d.size) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_50,row);
      local_50 = 0xffffffffffffffff;
      uVar5 = (int)(this->horizontalHeaderItems).d.size * row;
      local_48 = 0;
      uStack_40 = 0;
      iVar3 = (**(code **)(*(long *)this + 0x80))(this);
      for (lVar4 = (long)(int)uVar5; lVar4 < (int)(iVar3 * count + uVar5); lVar4 = lVar4 + 1) {
        pQVar1 = (this->tableItems).d.ptr[lVar4];
        if (pQVar1 != (QTableWidgetItem *)0x0) {
          pQVar1->view = (QTableWidget *)0x0;
          (*pQVar1->_vptr_QTableWidgetItem[1])();
        }
      }
      pcVar6 = (char *)0x0;
      if (0 < (int)uVar5) {
        pcVar6 = (char *)(ulong)uVar5;
      }
      QList<QTableWidgetItem_*>::remove(&this->tableItems,pcVar6);
      for (pcVar6 = (char *)(ulong)(uint)row; (int)pcVar6 < count + row; pcVar6 = pcVar6 + 1) {
        pQVar1 = (this->verticalHeaderItems).d.ptr[(long)pcVar6];
        if (pQVar1 != (QTableWidgetItem *)0x0) {
          pQVar1->view = (QTableWidget *)0x0;
          (*pQVar1->_vptr_QTableWidgetItem[1])();
        }
      }
      QList<QTableWidgetItem_*>::remove(&this->verticalHeaderItems,(char *)(ulong)(uint)row);
      QAbstractItemModel::endRemoveRows();
      bVar2 = true;
      goto LAB_00534a09;
    }
  }
  bVar2 = false;
LAB_00534a09:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::removeRows(int row, int count, const QModelIndex &)
{
    if (count < 1 || row < 0 || row + count > verticalHeaderItems.size())
        return false;

    beginRemoveRows(QModelIndex(), row, row + count - 1);
    int i = tableIndex(row, 0);
    int n = count * columnCount();
    QTableWidgetItem *oldItem = nullptr;
    for (int j = i; j < n + i; ++j) {
        oldItem = tableItems.at(j);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    tableItems.remove(qMax(i, 0), n);
    for (int v = row; v < row + count; ++v) {
        oldItem = verticalHeaderItems.at(v);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    verticalHeaderItems.remove(row, count);
    endRemoveRows();
    return true;
}